

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_number(string *number,unsigned_long_long H)

{
  ostream *poVar1;
  bool bVar2;
  string local_50 [32];
  
  if (number->_M_string_length % H == 0) {
    while (bVar2 = H != 0, H = H - 1, bVar2) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)number);
      poVar1 = std::operator<<((ostream *)&std::cout,local_50);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string(local_50);
    }
    return;
  }
  __assert_fail("0 == nl % H",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/mayan.calculation/main.cpp"
                ,0x15,"void print_number(std::string, unsigned long long)");
}

Assistant:

void print_number(std::string number, unsigned long long int H)
{
    unsigned long long int nl = number.length();
    assert(0 == nl % H);
    unsigned long long int W = nl/H;
    for (unsigned long long int i = 0; i < H; i++)
    {
        std::cout << number.substr(i*W, W) << std::endl;
    }
}